

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add127_test.cc
# Opt level: O0

void intgemm::anon_unknown_0::TestPrepareA<intgemm::SSSE3::Kernels8>(Index rows,Index cols)

{
  float *output;
  float *input;
  result_type_conflict rVar1;
  float quant_mult;
  AlignedVector<unsigned_char> newA;
  AlignedVector<signed_char> oldA;
  float *it;
  float *__end2;
  float *__begin2;
  AlignedVector<float> *__range2;
  AlignedVector<float> inputA;
  uniform_real_distribution<float> dist;
  mt19937 gen;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffebd8;
  Index cols_00;
  uniform_real_distribution<float> *in_stack_ffffffffffffebe0;
  int8_t *in_stack_ffffffffffffebe8;
  AlignedVector<float> *in_stack_ffffffffffffebf0;
  AlignedVector<unsigned_char> local_13f8;
  AlignedVector<signed_char> local_13e8 [2];
  float *local_13c8;
  float *local_13c0;
  float *local_13b8;
  AlignedVector<float> *local_13b0;
  AlignedVector<float> local_13a8 [24];
  Index in_stack_ffffffffffffede0;
  Index in_stack_ffffffffffffede4;
  uint8_t *in_stack_ffffffffffffede8;
  int8_t *in_stack_ffffffffffffedf0;
  
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)0x1e1f32);
  std::uniform_real_distribution<float>::uniform_real_distribution
            (in_stack_ffffffffffffebe0,(float)((ulong)in_stack_ffffffffffffebd8 >> 0x20),
             SUB84(in_stack_ffffffffffffebd8,0));
  AlignedVector<float>::AlignedVector
            (in_stack_ffffffffffffebf0,(size_t)in_stack_ffffffffffffebe8,
             (size_t)in_stack_ffffffffffffebe0);
  local_13b0 = local_13a8;
  local_13b8 = AlignedVector<float>::begin(local_13b0);
  local_13c0 = AlignedVector<float>::end(local_13b0);
  for (; local_13b8 != local_13c0; local_13b8 = local_13b8 + 1) {
    local_13c8 = local_13b8;
    rVar1 = std::uniform_real_distribution<float>::operator()
                      (in_stack_ffffffffffffebe0,in_stack_ffffffffffffebd8);
    *local_13c8 = rVar1;
  }
  AlignedVector<signed_char>::AlignedVector
            ((AlignedVector<signed_char> *)in_stack_ffffffffffffebf0,
             (size_t)in_stack_ffffffffffffebe8,(size_t)in_stack_ffffffffffffebe0);
  cols_00 = (Index)((ulong)in_stack_ffffffffffffebd8 >> 0x20);
  AlignedVector<unsigned_char>::AlignedVector
            ((AlignedVector<unsigned_char> *)in_stack_ffffffffffffebf0,
             (size_t)in_stack_ffffffffffffebe8,(size_t)in_stack_ffffffffffffebe0);
  AlignedVector<float>::begin(local_13a8);
  AlignedVector<signed_char>::begin(local_13e8);
  SSSE3::Kernels8::PrepareA
            ((float *)in_stack_ffffffffffffebf0,in_stack_ffffffffffffebe8,
             (float)((ulong)in_stack_ffffffffffffebe0 >> 0x20),(Index)in_stack_ffffffffffffebe0,
             cols_00);
  output = AlignedVector<float>::begin(local_13a8);
  input = (float *)AlignedVector<unsigned_char>::begin(&local_13f8);
  SSSE3::Kernels8::PrepareA
            (input,(uint8_t *)output,(float)((ulong)in_stack_ffffffffffffebe0 >> 0x20),
             (Index)in_stack_ffffffffffffebe0,cols_00);
  AlignedVector<signed_char>::begin(local_13e8);
  AlignedVector<unsigned_char>::begin(&local_13f8);
  CompareAs(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8,in_stack_ffffffffffffede4,
            in_stack_ffffffffffffede0);
  AlignedVector<unsigned_char>::~AlignedVector((AlignedVector<unsigned_char> *)0x1e2122);
  AlignedVector<signed_char>::~AlignedVector((AlignedVector<signed_char> *)0x1e212c);
  AlignedVector<float>::~AlignedVector((AlignedVector<float> *)0x1e2139);
  return;
}

Assistant:

void TestPrepareA(Index rows, Index cols) {
  std::mt19937 gen;
  // Go somewhat out of range too.
  std::uniform_real_distribution<float> dist(-2, 2);
  // Create array.
  AlignedVector<float> inputA(rows * cols);
  for (auto& it : inputA) {
    it = dist(gen);
  }
  AlignedVector<int8_t> oldA(rows * cols);
  AlignedVector<uint8_t> newA(rows * cols);
  float quant_mult = 64; //From example
  Routine::PrepareA(inputA.begin(), oldA.begin(), quant_mult, rows, cols);
  Routine::PrepareA(inputA.begin(), newA.begin(), quant_mult, rows, cols);
  CompareAs(oldA.begin(), newA.begin(), rows, cols);
}